

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool __thiscall cinatra::is_valid_utf8(cinatra *this,uchar *s,size_t length)

{
  cinatra cVar1;
  byte bVar2;
  cinatra *pcVar3;
  cinatra *pcVar4;
  byte bVar5;
  cinatra *pcVar6;
  
  bVar5 = (byte)length;
  if (s == (uchar *)0x0) {
    bVar2 = 1;
  }
  else {
    pcVar6 = (cinatra *)(s + (long)this);
    do {
      pcVar3 = this + 4;
      if ((pcVar6 < pcVar3) || ((*(uint *)this & 0x80808080) != 0)) {
        pcVar3 = this + 2;
        goto LAB_001e3025;
      }
      this = pcVar3;
    } while (pcVar3 != pcVar6);
    bVar5 = 0;
    bVar2 = 1;
  }
  goto LAB_001e3181;
  while (pcVar4 = pcVar3 + -1, pcVar3 = pcVar3 + 1, pcVar4 != pcVar6) {
LAB_001e3025:
    cVar1 = pcVar3[-2];
    if ((char)cVar1 < '\0') {
      if (((((byte)cVar1 & 0x60) == 0x40) && (pcVar3 + -1 < pcVar6)) &&
         (bVar2 = 0, ((byte)cVar1 & 0xde) != 0xc0)) {
        bVar5 = 0;
      }
      else {
        bVar2 = 0;
        bVar5 = 0;
      }
      goto LAB_001e3181;
    }
  }
  bVar5 = 1;
  bVar2 = 0;
LAB_001e3181:
  return (bool)(bVar2 | bVar5 & 1);
}

Assistant:

inline bool is_valid_utf8(unsigned char *s, size_t length) {
  for (unsigned char *e = s + length; s != e;) {
    if (s + 4 <= e && ((*(uint32_t *)s) & 0x80808080) == 0) {
      s += 4;
    }
    else {
      while (!(*s & 0x80)) {
        if (++s == e) {
          return true;
        }
      }

      if ((s[0] & 0x60) == 0x40) {
        if (s + 1 >= e || (s[1] & 0xc0) != 0x80 || (s[0] & 0xfe) == 0xc0) {
          return false;
        }
        s += 2;
      }
      else if ((s[0] & 0xf0) == 0xe0) {
        if (s + 2 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
            (s[0] == 0xe0 && (s[1] & 0xe0) == 0x80) ||
            (s[0] == 0xed && (s[1] & 0xe0) == 0xa0)) {
          return false;
        }
        s += 3;
      }
      else if ((s[0] & 0xf8) == 0xf0) {
        if (s + 3 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
            (s[3] & 0xc0) != 0x80 || (s[0] == 0xf0 && (s[1] & 0xf0) == 0x80) ||
            (s[0] == 0xf4 && s[1] > 0x8f) || s[0] > 0xf4) {
          return false;
        }
        s += 4;
      }
      else {
        return false;
      }
    }
  }
  return true;
}